

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

Aig_Obj_t * Fra_ClausGetLiteral(Clu_Man_t *p,int *pVar2Id,int Lit)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  
  iVar1 = pVar2Id[Lit >> 1];
  if ((long)iVar1 < 0) {
    __assert_fail("NodeId >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                  ,0x5f4,"Aig_Obj_t *Fra_ClausGetLiteral(Clu_Man_t *, int *, int)");
  }
  pVVar2 = p->pAig->vObjs;
  if (iVar1 < pVVar2->nSize) {
    return (Aig_Obj_t *)((ulong)(Lit & 1) ^ *(ulong *)((long)pVVar2->pArray[iVar1] + 0x28));
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Obj_t * Fra_ClausGetLiteral( Clu_Man_t * p, int * pVar2Id, int Lit )
{
    Aig_Obj_t * pLiteral;
    int NodeId = pVar2Id[ lit_var(Lit) ];
    assert( NodeId >= 0 );
    pLiteral = (Aig_Obj_t *)Aig_ManObj( p->pAig, NodeId )->pData;
    return Aig_NotCond( pLiteral, lit_sign(Lit) );
}